

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O3

void test_example_cpp(bool copy_on_write)

{
  _Bool _Var1;
  ostream *poVar2;
  uint64_t uVar3;
  uint32_t *ans;
  size_t maxbytes;
  char *buf;
  size_t sVar4;
  size_type sVar5;
  ulong uVar6;
  uint32_t i;
  uint32_t uVar7;
  initializer_list<unsigned_int> l;
  initializer_list<unsigned_int> l_00;
  initializer_list<unsigned_int> l_01;
  initializer_list<unsigned_int> l_02;
  uint32_t counter;
  Roaring b;
  Roaring a;
  uint32_t element;
  Roaring r1;
  Roaring r2;
  Roaring r3;
  Roaring rogue;
  Roaring t;
  Roaring r2id;
  Roaring t2;
  Roaring r1_2_3;
  Roaring bigunion;
  Roaring z;
  Roaring r1f;
  Roaring r2i;
  uint32_t values [3];
  const_iterator j;
  Roaring i1_2;
  uint32_t manyvalues [5];
  Roaring *allmybitmaps [3];
  uint local_31c;
  pointer local_318;
  container_s **ppcStack_310;
  uint16_t *local_308;
  uint8_t *puStack_300;
  undefined8 local_2f8;
  undefined1 local_2e8 [32];
  undefined8 local_2c8;
  uint32_t local_2bc;
  roaring_array_t local_2b8;
  roaring_bitmap_t local_290;
  roaring_array_t local_268;
  roaring_uint32_iterator_t local_238;
  roaring_bitmap_t local_210;
  uint local_1e4 [3];
  roaring_array_t local_1d8;
  roaring_bitmap_t local_1a8;
  roaring_bitmap_t local_180;
  roaring_bitmap_t local_158;
  roaring_bitmap_t local_130;
  roaring_bitmap_t local_108;
  roaring_bitmap_t local_e0;
  uint32_t local_b8 [4];
  roaring_uint32_iterator_t local_a8;
  Roaring local_80;
  uint32_t local_58 [8];
  roaring_array_t *local_38;
  roaring_bitmap_t *local_30;
  roaring_array_t *local_28;
  
  local_2b8.keys = (uint16_t *)0x0;
  local_2b8.typecodes = (uint8_t *)0x0;
  local_2b8.size = 0;
  local_2b8.allocation_size = 0;
  local_2b8.containers = (container_s **)0x0;
  local_2b8.flags = '\0';
  local_2b8._33_7_ = 0;
  roaring_bitmap_init_with_capacity((roaring_bitmap_t *)&local_2b8,0);
  local_2b8.flags = local_2b8.flags & 0xfe | copy_on_write;
  uVar7 = 100;
  do {
    roaring_bitmap_add((roaring_bitmap_t *)&local_2b8,uVar7);
    uVar7 = uVar7 + 1;
  } while (uVar7 != 1000);
  _Var1 = roaring_bitmap_contains((roaring_bitmap_t *)&local_2b8,500);
  _assert_true((ulong)_Var1,"r1.contains(500)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x13c);
  roaring_bitmap_get_cardinality((roaring_bitmap_t *)&local_2b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cardinality = ",0xe);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  roaring_bitmap_portable_size_in_bytes((roaring_bitmap_t *)&local_2b8);
  roaring_bitmap_run_optimize((roaring_bitmap_t *)&local_2b8);
  roaring_bitmap_portable_size_in_bytes((roaring_bitmap_t *)&local_2b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"size before run optimize ",0x19);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," bytes, and after ",0x12);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," bytes.",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  sVar5 = 2;
  roaring::Roaring::bitmapOf((Roaring *)&local_290,5,1,2,3,5,6);
  roaring_bitmap_printf(&local_290);
  putchar(10);
  local_1d8.size = 1;
  local_1d8.allocation_size = 2;
  local_1d8.containers = (container_s **)0x500000003;
  local_1d8.keys._0_4_ = 6;
  l._M_len = sVar5;
  l._M_array = (iterator)0x5;
  roaring::Roaring::bitmapOfList((Roaring *)&local_e0,(Roaring *)&local_1d8,l);
  _Var1 = roaring_bitmap_equals(&local_e0,&local_290);
  _assert_true((ulong)_Var1,"r2i == r2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x153);
  local_268.size = 1;
  local_268.allocation_size = 2;
  local_268.containers = (container_s **)0x500000003;
  local_268.keys._0_4_ = 6;
  l_00._M_len = 5;
  l_00._M_array = (iterator)&local_268;
  roaring::Roaring::Roaring((Roaring *)&local_1d8,l_00);
  _Var1 = roaring_bitmap_equals((roaring_bitmap_t *)&local_1d8,&local_290);
  _assert_true((ulong)_Var1,"r2id == r2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x158);
  roaring_bitmap_select(&local_290,3,&local_2bc);
  _assert_true((ulong)(local_2bc == 5),"element == 5",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x15d);
  uVar7 = roaring_bitmap_minimum(&local_290);
  _assert_true((ulong)(uVar7 == 1),"r2.minimum() == 1",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x15f);
  uVar7 = roaring_bitmap_maximum(&local_290);
  _assert_true((ulong)(uVar7 == 6),"r2.maximum() == 6",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x161);
  uVar3 = roaring_bitmap_rank(&local_290,4);
  _assert_true((ulong)(uVar3 == 3),"r2.rank(4) == 3",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x163);
  local_b8[0] = 2;
  local_b8[1] = 3;
  local_b8[2] = 4;
  roaring::Roaring::Roaring((Roaring *)&local_268,3,local_b8);
  local_268.flags = local_268.flags & 0xfe | copy_on_write;
  uVar3 = roaring_bitmap_get_cardinality((roaring_bitmap_t *)&local_2b8);
  ans = (uint32_t *)operator_new__(-(ulong)(uVar3 >> 0x3e != 0) | uVar3 * 4);
  _assert_true(1,"arr1 != NULL",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x16d);
  roaring_bitmap_to_uint32_array((roaring_bitmap_t *)&local_2b8,ans);
  roaring::Roaring::Roaring((Roaring *)&local_108,uVar3,ans);
  operator_delete__(ans);
  _Var1 = roaring_bitmap_equals((roaring_bitmap_t *)&local_2b8,&local_108);
  _assert_true((ulong)_Var1,"r1 == r1f",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x173);
  roaring::Roaring::Roaring((Roaring *)&local_130,(Roaring *)&local_268);
  local_130.high_low_container.flags = local_130.high_low_container.flags & 0xfe | copy_on_write;
  _Var1 = roaring_bitmap_equals((roaring_bitmap_t *)&local_268,&local_130);
  _assert_true((ulong)_Var1,"r3 == z",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x178);
  roaring::Roaring::operator|((Roaring *)&local_180,(Roaring *)&local_2b8,(Roaring *)&local_290);
  local_180.high_low_container.flags = local_180.high_low_container.flags & 0xfe | copy_on_write;
  roaring_bitmap_or_inplace(&local_180,(roaring_bitmap_t *)&local_268);
  local_38 = &local_2b8;
  local_30 = &local_290;
  local_28 = &local_268;
  roaring::Roaring::fastunion((Roaring *)&local_158,3,(Roaring **)&local_38);
  _Var1 = roaring_bitmap_equals(&local_180,&local_158);
  _assert_true((ulong)_Var1,"r1_2_3 == bigunion",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x182);
  roaring::Roaring::operator&(&local_80,(Roaring *)&local_2b8,(Roaring *)&local_290);
  maxbytes = roaring_bitmap_portable_size_in_bytes((roaring_bitmap_t *)&local_2b8);
  buf = (char *)operator_new__(maxbytes);
  roaring_bitmap_portable_serialize((roaring_bitmap_t *)&local_2b8,buf);
  roaring::Roaring::read((int)&local_210,buf,1);
  sVar4 = roaring_bitmap_portable_size_in_bytes(&local_210);
  _assert_true((ulong)(maxbytes == sVar4),"expectedsize == t.getSizeInBytes()",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x18c);
  _Var1 = roaring_bitmap_equals((roaring_bitmap_t *)&local_2b8,&local_210);
  _assert_true((ulong)_Var1,"r1 == t",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x18d);
  roaring::Roaring::readSafe((Roaring *)&local_1a8,buf,maxbytes);
  sVar4 = roaring_bitmap_portable_size_in_bytes(&local_1a8);
  _assert_true((ulong)(maxbytes == sVar4),"expectedsize == t2.getSizeInBytes()",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,400);
  _Var1 = roaring_bitmap_equals((roaring_bitmap_t *)&local_2b8,&local_1a8);
  _assert_true((ulong)_Var1,"r1 == t2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x191);
  operator_delete__(buf);
  local_31c = 0;
  roaring_iterate((roaring_bitmap_t *)&local_2b8,roaring_iterator_sumall,&local_31c);
  local_31c = 0;
  local_238.typecode = '\0';
  local_238.parent = (roaring_bitmap_t *)0x0;
  local_238.container = (void *)0x0;
  local_238.container_index = 0;
  local_238.highbits = 0;
  local_238.container_it.index = 0;
  local_238.current_value = 0;
  local_238.has_value = false;
  roaring_iterator_init(&local_210,&local_238);
  while( true ) {
    if (roaring::Roaring::end()::e == '\0') {
      test_example_cpp();
    }
    if ((local_238.current_value == roaring::Roaring::end()::e._32_4_) &&
       (local_238.has_value == (_Bool)roaring::Roaring::end()::e[0x24])) break;
    local_31c = local_31c + 1;
    roaring_uint32_iterator_advance(&local_238);
  }
  uVar6 = (ulong)local_31c;
  uVar3 = roaring_bitmap_get_cardinality(&local_210);
  _assert_true((ulong)(uVar3 == uVar6),"counter == t.cardinality()",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x1a3);
  local_58[0] = 2;
  local_58[1] = 3;
  local_58[2] = 4;
  local_58[3] = 7;
  local_58[4] = 8;
  roaring::Roaring::Roaring((Roaring *)&local_238,5,local_58);
  local_a8.parent = (roaring_bitmap_t *)0x0;
  local_a8.container = (void *)0x0;
  local_a8.typecode = '\0';
  local_a8.container_index = 0;
  local_a8.highbits = 0;
  local_a8.container_it.index = 0;
  local_a8.current_value = 0;
  local_a8.has_value = false;
  roaring_iterator_init((roaring_bitmap_t *)&local_238,&local_a8);
  roaring_uint32_iterator_move_equalorlarger(&local_a8,4);
  _assert_true((ulong)(local_a8.current_value == 4),"*j == 4",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x1aa);
  local_308 = (uint16_t *)0x0;
  puStack_300 = (uint8_t *)0x0;
  local_318 = (pointer)0x0;
  ppcStack_310 = (container_s **)0x0;
  local_2f8._0_1_ = '\0';
  local_2f8._1_7_ = 0;
  roaring_bitmap_init_with_capacity((roaring_bitmap_t *)&local_318,0);
  roaring_bitmap_add((roaring_bitmap_t *)&local_318,10);
  roaring_bitmap_add((roaring_bitmap_t *)&local_318,0x14);
  local_2c8._0_1_ = (uint8_t)local_2f8;
  local_2c8._1_7_ = local_2f8._1_7_;
  local_2e8._16_8_ = local_308;
  local_2e8._24_8_ = puStack_300;
  local_2e8._0_8_ = local_318;
  local_2e8._8_8_ = ppcStack_310;
  roaring_bitmap_init_with_capacity((roaring_bitmap_t *)&local_318,0);
  uVar3 = roaring_bitmap_get_cardinality((roaring_bitmap_t *)local_2e8);
  _assert_true((ulong)(uVar3 == 2),"a.cardinality() == 2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x1b3);
  _Var1 = roaring_bitmap_contains((roaring_bitmap_t *)local_2e8,10);
  _assert_true((ulong)_Var1,"a.contains(10)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x1b4);
  _Var1 = roaring_bitmap_contains((roaring_bitmap_t *)local_2e8,0x14);
  _assert_true((ulong)_Var1,"a.contains(20)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x1b5);
  uVar3 = roaring_bitmap_get_cardinality((roaring_bitmap_t *)&local_318);
  _assert_true((ulong)(uVar3 == 0),"b.cardinality() == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x1b9);
  roaring::Roaring::~Roaring((Roaring *)local_2e8);
  roaring::Roaring::~Roaring((Roaring *)&local_318);
  local_308 = (uint16_t *)0x0;
  puStack_300 = (uint8_t *)0x0;
  local_318 = (pointer)0x0;
  ppcStack_310 = (container_s **)0x0;
  local_2f8._0_1_ = '\0';
  local_2f8._1_7_ = 0;
  roaring_bitmap_init_with_capacity((roaring_bitmap_t *)&local_318,0);
  roaring_bitmap_add((roaring_bitmap_t *)&local_318,10);
  roaring_bitmap_add((roaring_bitmap_t *)&local_318,0x14);
  local_2e8._16_8_ = (uint16_t *)0x0;
  local_2e8._24_8_ = (uint8_t *)0x0;
  local_2e8._0_8_ = (char *)0x0;
  local_2e8._8_8_ = (container_s **)0x0;
  local_2c8._0_1_ = '\0';
  local_2c8._1_7_ = 0;
  roaring_bitmap_init_with_capacity((roaring_bitmap_t *)local_2e8,0);
  roaring::Roaring::operator=((Roaring *)local_2e8,(Roaring *)&local_318);
  uVar3 = roaring_bitmap_get_cardinality((roaring_bitmap_t *)local_2e8);
  _assert_int_equal(2,uVar3,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
                    ,0x1c5);
  _Var1 = roaring_bitmap_contains((roaring_bitmap_t *)local_2e8,10);
  _assert_true((ulong)_Var1,"a.contains(10)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x1c6);
  _Var1 = roaring_bitmap_contains((roaring_bitmap_t *)local_2e8,0x14);
  _assert_true((ulong)_Var1,"a.contains(20)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x1c7);
  uVar3 = roaring_bitmap_get_cardinality((roaring_bitmap_t *)&local_318);
  _assert_int_equal(0,uVar3,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
                    ,0x1cb);
  roaring::Roaring::~Roaring((Roaring *)local_2e8);
  roaring::Roaring::~Roaring((Roaring *)&local_318);
  local_308 = (uint16_t *)0x0;
  puStack_300 = (uint8_t *)0x0;
  local_318 = (pointer)0x0;
  ppcStack_310 = (container_s **)0x0;
  local_2f8._0_1_ = '\0';
  local_2f8._1_7_ = 0;
  roaring_bitmap_init_with_capacity((roaring_bitmap_t *)&local_318,0);
  roaring_bitmap_add((roaring_bitmap_t *)&local_318,10);
  roaring_bitmap_add((roaring_bitmap_t *)&local_318,0x14);
  local_1e4[0] = 10;
  local_1e4[1] = 0x14;
  l_01._M_len = 2;
  l_01._M_array = local_1e4;
  roaring::Roaring::Roaring((Roaring *)local_2e8,l_01);
  _Var1 = roaring_bitmap_equals((roaring_bitmap_t *)&local_318,(roaring_bitmap_t *)local_2e8);
  _assert_true((ulong)_Var1,"a == b",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x1d6);
  roaring_bitmap_add((roaring_bitmap_t *)&local_318,0x1e);
  local_1e4[0] = 10;
  local_1e4[1] = 0x14;
  local_1e4[2] = 0x1e;
  l_02._M_len = 3;
  l_02._M_array = local_1e4;
  roaring::Roaring::operator=((Roaring *)local_2e8,l_02);
  _Var1 = roaring_bitmap_equals((roaring_bitmap_t *)&local_318,(roaring_bitmap_t *)local_2e8);
  _assert_true((ulong)_Var1,"a == b",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x1db);
  roaring::Roaring::~Roaring((Roaring *)local_2e8);
  roaring::Roaring::~Roaring((Roaring *)&local_318);
  local_308 = (uint16_t *)0x0;
  puStack_300 = (uint8_t *)0x0;
  local_318 = (pointer)0x0;
  ppcStack_310 = (container_s **)0x0;
  local_2f8._0_1_ = '\0';
  local_2f8._1_7_ = 0;
  roaring_bitmap_init_with_capacity((roaring_bitmap_t *)&local_318,0);
  roaring_bitmap_add((roaring_bitmap_t *)&local_318,1);
  roaring_bitmap_add((roaring_bitmap_t *)&local_318,2);
  roaring_bitmap_add((roaring_bitmap_t *)&local_318,3);
  roaring_bitmap_add((roaring_bitmap_t *)&local_318,4);
  roaring::Roaring::toString_abi_cxx11_((string *)local_2e8,(Roaring *)&local_318);
  _assert_string_equal
            ("{1,2,3,4}",(char *)local_2e8._0_8_,
             "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
             ,0x1e6);
  if ((undefined1 *)local_2e8._0_8_ != local_2e8 + 0x10) {
    operator_delete((void *)local_2e8._0_8_);
  }
  roaring::Roaring::~Roaring((Roaring *)&local_318);
  roaring::Roaring::~Roaring((Roaring *)&local_238);
  roaring::Roaring::~Roaring((Roaring *)&local_1a8);
  roaring::Roaring::~Roaring((Roaring *)&local_210);
  roaring::Roaring::~Roaring(&local_80);
  roaring::Roaring::~Roaring((Roaring *)&local_158);
  roaring::Roaring::~Roaring((Roaring *)&local_180);
  roaring::Roaring::~Roaring((Roaring *)&local_130);
  roaring::Roaring::~Roaring((Roaring *)&local_108);
  roaring::Roaring::~Roaring((Roaring *)&local_268);
  roaring::Roaring::~Roaring((Roaring *)&local_1d8);
  roaring::Roaring::~Roaring((Roaring *)&local_e0);
  roaring::Roaring::~Roaring((Roaring *)&local_290);
  roaring::Roaring::~Roaring((Roaring *)&local_2b8);
  return;
}

Assistant:

void test_example_cpp(bool copy_on_write) {
    // create a new empty bitmap
    Roaring r1;
    r1.setCopyOnWrite(copy_on_write);
    // then we can add values
    for (uint32_t i = 100; i < 1000; i++) {
        r1.add(i);
    }

    // check whether a value is contained
    assert_true(r1.contains(500));

    // compute how many bits there are:
    uint64_t cardinality = r1.cardinality();
    std::cout << "Cardinality = " << cardinality << std::endl;

    // if your bitmaps have long runs, you can compress them by calling
    // run_optimize
    size_t size = r1.getSizeInBytes();
    r1.runOptimize();
    size_t compact_size = r1.getSizeInBytes();

    std::cout << "size before run optimize " << size << " bytes, and after "
              << compact_size << " bytes." << std::endl;

    // create a new bitmap with varargs
    Roaring r2 = Roaring::bitmapOf(5, 1, 2, 3, 5, 6);

    r2.printf();
    printf("\n");
    // create a new bitmap with initializer list
    Roaring r2i = Roaring::bitmapOfList({1, 2, 3, 5, 6});

    assert_true(r2i == r2);

    // create a new bitmap directly from initializer list
    Roaring r2id = {1, 2, 3, 5, 6};

    assert_true(r2id == r2);

    // test select
    uint32_t element;
    r2.select(3, &element);
    assert_true(element == 5);

    assert_true(r2.minimum() == 1);

    assert_true(r2.maximum() == 6);

    assert_true(r2.rank(4) == 3);

    // we can also create a bitmap from a pointer to 32-bit integers
    const uint32_t values[] = {2, 3, 4};
    Roaring r3(3, values);
    r3.setCopyOnWrite(copy_on_write);

    // we can also go in reverse and go from arrays to bitmaps
    uint64_t card1 = r1.cardinality();
    uint32_t *arr1 = new uint32_t[card1];
    assert_true(arr1 != NULL);
    r1.toUint32Array(arr1);
    Roaring r1f(card1, arr1);
    delete[] arr1;

    // bitmaps shall be equal
    assert_true(r1 == r1f);

    // we can copy and compare bitmaps
    Roaring z(r3);
    z.setCopyOnWrite(copy_on_write);
    assert_true(r3 == z);

    // we can compute union two-by-two
    Roaring r1_2_3 = r1 | r2;
    r1_2_3.setCopyOnWrite(copy_on_write);
    r1_2_3 |= r3;

    // we can compute a big union
    const Roaring *allmybitmaps[] = {&r1, &r2, &r3};
    Roaring bigunion = Roaring::fastunion(3, allmybitmaps);
    assert_true(r1_2_3 == bigunion);

    // we can compute intersection two-by-two
    Roaring i1_2 = r1 & r2;

    // we can write a bitmap to a pointer and recover it later
    size_t expectedsize = r1.getSizeInBytes();
    char *serializedbytes = new char[expectedsize];
    r1.write(serializedbytes);
    Roaring t = Roaring::read(serializedbytes);
    assert_true(expectedsize == t.getSizeInBytes());
    assert_true(r1 == t);

    Roaring t2 = Roaring::readSafe(serializedbytes, expectedsize);
    assert_true(expectedsize == t2.getSizeInBytes());
    assert_true(r1 == t2);

    delete[] serializedbytes;

    // we can iterate over all values using custom functions
    uint32_t counter = 0;
    r1.iterate(roaring_iterator_sumall, &counter);
    /**
     * void roaring_iterator_sumall(uint32_t value, void *param) {
     *        *(uint32_t *) param += value;
     *  }
     *
     */
    // we can also iterate the C++ way
    counter = 0;
    for (Roaring::const_iterator i = t.begin(); i != t.end(); i++) {
        ++counter;
    }
    assert_true(counter == t.cardinality());

    // we can move iterators
    const uint32_t manyvalues[] = {2, 3, 4, 7, 8};
    Roaring rogue(5, manyvalues);
    Roaring::const_iterator j = rogue.begin();
    j.move_equalorlarger(4);
    assert_true(*j == 4);

    // test move constructor
    {
        Roaring b;
        b.add(10);
        b.add(20);

        Roaring a(std::move(b));
        assert_true(a.cardinality() == 2);
        assert_true(a.contains(10));
        assert_true(a.contains(20));

        // Our move semantics allow moved-from objects to continue to be used
        // normally (they are reset to empty Roarings).
        assert_true(b.cardinality() == 0);
    }

    // test move operator
    {
        Roaring b;
        b.add(10);
        b.add(20);

        Roaring a;

        a = std::move(b);
        assert_int_equal(2, a.cardinality());
        assert_true(a.contains(10));
        assert_true(a.contains(20));

        // Our move semantics allow moved-from objects to continue to be used
        // normally (they are reset to empty Roarings).
        assert_int_equal(0, b.cardinality());
    }

    // test initializer lists
    {
        Roaring a;
        a.add(10);
        a.add(20);

        // construction
        Roaring b({10, 20});
        assert_true(a == b);

        a.add(30);
        // assignment
        b = {10, 20, 30};
        assert_true(a == b);
    }

    // test toString
    {
        Roaring a;
        a.add(1);
        a.add(2);
        a.add(3);
        a.add(4);

        assert_string_equal("{1,2,3,4}", a.toString().c_str());
    }
}